

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

void uv__fs_done(uv__work *w,int status)

{
  uv_fs_t *req;
  int status_local;
  uv__work *w_local;
  
  if ((w[-7].loop)->active_reqs == (void **)(w[-7].loop)->active_reqs[0]) {
    __assert_fail("uv__has_active_reqs(req->loop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/fs.c"
                  ,0x3e3,"void uv__fs_done(struct uv__work *, int)");
  }
  *(_func_void_uv__work_ptr **)w[-8].done = w[-8].work;
  *(_func_void_uv__work_ptr_int **)(w[-8].work + 8) = w[-8].done;
  if (status == -0x7d) {
    if (w[-7].wq[1] != (void *)0x0) {
      __assert_fail("req->result == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/fs.c"
                    ,0x3e6,"void uv__fs_done(struct uv__work *, int)");
    }
    w[-7].wq[1] = (void *)0xffffffffffffff83;
  }
  (*(code *)w[-7].wq[0])(w[-9].wq);
  return;
}

Assistant:

static void uv__fs_done(struct uv__work* w, int status) {
  uv_fs_t* req;

  req = container_of(w, uv_fs_t, work_req);
  uv__req_unregister(req->loop, req);

  if (status == UV_ECANCELED) {
    assert(req->result == 0);
    req->result = UV_ECANCELED;
  }

  req->cb(req);
}